

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O3

void __thiscall libchars::edit_object::wipe(edit_object *this)

{
  char *pcVar1;
  ulong uVar2;
  
  if (this->insert_idx < this->buflen) {
    pcVar1 = this->buffer + (this->buflen - 1);
    do {
      *pcVar1 = '\0';
      uVar2 = this->buflen - 1;
      this->buflen = uVar2;
      pcVar1 = pcVar1 + -1;
    } while (this->insert_idx < uVar2);
    if (uVar2 == 0) {
      (*this->_vptr_edit_object[2])();
      return;
    }
  }
  return;
}

Assistant:

virtual void wipe()
        {
            if (buflen > insert_idx) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > insert_idx) {
                    *p-- = 0;
                    --buflen;
                }
                if (buflen == 0)
                    emptied();
            }
        }